

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_loadDict(LZ4_stream_t *LZ4_dict,char *dictionary,int dictSize)

{
  int iVar1;
  char *pcVar2;
  long *plVar3;
  U32 *hashTable;
  int iVar4;
  uint uVar5;
  
  if ((*(int *)((long)LZ4_dict->table + 0x4004) != 0) ||
     (uVar5 = (uint)LZ4_dict->table[0x800], 0x40000000 < uVar5)) {
    uVar5 = 0;
    memset(LZ4_dict,0,0x4020);
  }
  if (dictSize < 8) {
    LZ4_dict->table[0x801] = 0;
    *(undefined4 *)(LZ4_dict->table + 0x803) = 0;
    iVar1 = 0;
  }
  else {
    pcVar2 = dictionary + dictSize;
    plVar3 = (long *)(pcVar2 + -0x10000);
    if ((uint)dictSize < 0x10001) {
      plVar3 = (long *)dictionary;
    }
    LZ4_dict->table[0x801] = (longlong)plVar3;
    iVar1 = (int)pcVar2 - (int)plVar3;
    *(int *)(LZ4_dict->table + 0x803) = iVar1;
    iVar4 = uVar5 + 0x10000;
    *(uint *)(LZ4_dict->table + 0x800) = uVar5 + iVar1 + 0x10000;
    for (; plVar3 <= pcVar2 + -8; plVar3 = (long *)((long)plVar3 + 3)) {
      *(int *)((long)LZ4_dict->table +
              (ulong)((uint)((ulong)(*plVar3 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) = iVar4;
      iVar4 = iVar4 + 3;
    }
  }
  return iVar1;
}

Assistant:

int LZ4_loadDict (LZ4_stream_t* LZ4_dict, const char* dictionary, int dictSize)
{
    LZ4_stream_t_internal* dict = (LZ4_stream_t_internal*) LZ4_dict;
    const BYTE* p = (const BYTE*)dictionary;
    const BYTE* const dictEnd = p + dictSize;
    const BYTE* base;

    if ((dict->initCheck) || (dict->currentOffset > 1 GB))  /* Uninitialized structure, or reuse overflow */
        LZ4_resetStream(LZ4_dict);

    if (dictSize < (int)HASH_UNIT)
    {
        dict->dictionary = NULL;
        dict->dictSize = 0;
        return 0;
    }

    if ((dictEnd - p) > 64 KB) p = dictEnd - 64 KB;
    dict->currentOffset += 64 KB;
    base = p - dict->currentOffset;
    dict->dictionary = p;
    dict->dictSize = (U32)(dictEnd - p);
    dict->currentOffset += dict->dictSize;

    while (p <= dictEnd-HASH_UNIT)
    {
        LZ4_putPosition(p, dict->hashTable, byU32, base);
        p+=3;
    }

    return dict->dictSize;
}